

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O1

uLong crc32_z(unsigned_long crc,uchar *buf,z_size_t len)

{
  uint uVar1;
  uchar *puVar2;
  z_size_t zVar3;
  uint uVar4;
  ulong uVar5;
  
  if (buf == (uchar *)0x0) {
    return 0;
  }
  uVar4 = ~(uint)crc;
  if (((ulong)buf & 3) != 0 && len != 0) {
    puVar2 = buf + 1;
    zVar3 = len;
    do {
      uVar1 = *(uint *)buf;
      buf = (uchar *)((long)buf + 1);
      uVar4 = uVar4 >> 8 ^ crc_table[0][(byte)((byte)uVar1 ^ (byte)uVar4)];
      len = zVar3 - 1;
      if (zVar3 == 1) break;
      uVar5 = (ulong)puVar2 & 3;
      puVar2 = puVar2 + 1;
      zVar3 = len;
    } while (uVar5 != 0);
  }
  for (; 0x1f < len; len = len - 0x20) {
    uVar4 = uVar4 ^ *(uint *)buf;
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 4);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 8);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 0xc);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 0x10);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 0x14);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 0x18);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18] ^ *(uint *)((long)buf + 0x1c);
    buf = (uchar *)((long)buf + 0x20);
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18];
  }
  for (; 3 < len; len = len - 4) {
    uVar4 = uVar4 ^ *(uint *)buf;
    uVar4 = crc_table[2][uVar4 >> 8 & 0xff] ^ crc_table[3][uVar4 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar4 >> 0x18];
    buf = (uchar *)((long)buf + 4);
  }
  if (len != 0) {
    uVar5 = 0;
    do {
      uVar4 = uVar4 >> 8 ^ crc_table[0][(byte)(*(byte *)((long)buf + uVar5) ^ (byte)uVar4)];
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
  }
  return (ulong)~uVar4;
}

Assistant:

unsigned long ZEXPORT crc32_z(crc, buf, len)
    unsigned long crc;
    const unsigned char FAR *buf;
    z_size_t len;
{
    if (buf == Z_NULL) return 0UL;

#ifdef DYNAMIC_CRC_TABLE
    if (crc_table_empty)
        make_crc_table();
#endif /* DYNAMIC_CRC_TABLE */

#ifdef BYFOUR
    if (sizeof(void *) == sizeof(ptrdiff_t)) {
        z_crc_t endian;

        endian = 1;
        if (*((unsigned char *)(&endian)))
            return crc32_little(crc, buf, len);
        else
            return crc32_big(crc, buf, len);
    }
#endif /* BYFOUR */
    crc = crc ^ 0xffffffffUL;
    while (len >= 8) {
        DO8;
        len -= 8;
    }
    if (len) do {
        DO1;
    } while (--len);
    return crc ^ 0xffffffffUL;
}